

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphClassDefn.cpp
# Opt level: O2

void __thiscall
GdlGlyphClassDefn::FlattenGlyphList
          (GdlGlyphClassDefn *this,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vgidFlattened)

{
  pointer puVar1;
  size_t igid;
  ulong uVar2;
  long lVar3;
  
  if (this->m_fHasFlatList == false) {
    FlattenMyGlyphList(this);
  }
  lVar3 = 0;
  for (uVar2 = 0;
      puVar1 = (this->m_vgidFlattened).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->m_vgidFlattened).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 1);
      uVar2 = uVar2 + 1) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (vgidFlattened,(value_type_conflict3 *)((long)puVar1 + lVar3));
    lVar3 = lVar3 + 2;
  }
  return;
}

Assistant:

void GdlGlyphClassDefn::FlattenGlyphList(std::vector<utf16> & vgidFlattened)
{
	if (!m_fHasFlatList)
		FlattenMyGlyphList();
	for (size_t igid = 0; igid < m_vgidFlattened.size(); igid++)
	{
		vgidFlattened.push_back(m_vgidFlattened[igid]);
	}
}